

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
bitmanip::detail::stringify_impl<unsigned_int,3ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,uint (*arr) [3])

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  string result;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  stringify_impl<unsigned_int>(&local_50,(uint *)this);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x119c8e);
  local_70 = &local_60;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::reserve((ulong)&local_70);
  lVar3 = 0;
  do {
    std::__cxx11::string::append((char *)&local_70);
    stringify_impl<unsigned_int>(&local_50,(uint *)(this + lVar3 + 4));
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_70,local_68 + (long)local_70);
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto stringify_impl(const T (&arr)[N])
{
    std::string result = "{" + stringify_impl(arr[0]);
    result.reserve((result.length() + 1) * N + 1);

    for (std::size_t i = 1; i < N; ++i) {
        result += ", ";
        result += stringify_impl(arr[i]);
    }

    return result + '}';
}